

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O1

string * __thiscall
cmFileAPI::WriteJsonFile
          (string *__return_storage_ptr__,cmFileAPI *this,Value *value,string *prefix,
          _func_string_string_ptr *computeSuffix)

{
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  StreamWriter *pSVar4;
  bool bVar5;
  undefined8 *puVar6;
  long *plVar7;
  size_type *psVar8;
  ulong uVar9;
  undefined8 uVar10;
  __hashtable *__h;
  string file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  __node_gen_type __node_gen;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  ofstream ftmp;
  string local_2d0;
  string local_2b0;
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_290;
  undefined8 local_288;
  long local_280;
  undefined8 uStack_278;
  ulong *local_270;
  long local_268;
  ulong local_260 [2];
  string local_250;
  undefined1 local_230 [32];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  pcVar3 = (this->APIv1)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b0,pcVar3,pcVar3 + (this->APIv1)._M_string_length);
  std::__cxx11::string::append((char *)&local_2b0);
  std::ofstream::ofstream(local_230,local_2b0._M_dataplus._M_p,_S_out);
  pSVar4 = (this->JsonWriter)._M_t.
           super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>._M_t.
           super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>.
           super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl;
  (*pSVar4->_vptr_StreamWriter[2])(pSVar4,value,local_230);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"\n",1);
  std::ofstream::close();
  if ((abStack_210[(long)*(_func_int **)(local_230._0_8_ + -0x18)] & 5) != 0) {
    cmsys::SystemTools::RemoveFile(&local_2b0);
    goto LAB_003688e9;
  }
  pcVar3 = (prefix->_M_dataplus)._M_p;
  local_270 = local_260;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,pcVar3,pcVar3 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_270);
  (*computeSuffix)(&local_250,&local_2b0);
  uVar9 = 0xf;
  if (local_270 != local_260) {
    uVar9 = local_260[0];
  }
  if (uVar9 < local_250._M_string_length + local_268) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar10 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_250._M_string_length + local_268) goto LAB_003686f8;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_270);
  }
  else {
LAB_003686f8:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_250._M_dataplus._M_p);
  }
  local_290 = (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               *)&local_280;
  p_Var1 = (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            *)(puVar6 + 2);
  if ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
       *)*puVar6 == p_Var1) {
    local_280 = *(long *)p_Var1;
    uStack_278 = puVar6[3];
  }
  else {
    local_280 = *(long *)p_Var1;
    local_290 = (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 *)*puVar6;
  }
  local_288 = puVar6[1];
  *puVar6 = p_Var1;
  puVar6[1] = 0;
  *p_Var1 = (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
             )0x0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_290);
  paVar2 = &local_2d0.field_2;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_2d0.field_2._M_allocated_capacity = *psVar8;
    local_2d0.field_2._8_8_ = plVar7[3];
    local_2d0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_2d0.field_2._M_allocated_capacity = *psVar8;
    local_2d0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_2d0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if (local_290 !=
      (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
       *)&local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if (local_270 != local_260) {
    operator_delete(local_270,local_260[0] + 1);
  }
  pcVar3 = (this->APIv1)._M_dataplus._M_p;
  local_2d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d0,pcVar3,pcVar3 + (this->APIv1)._M_string_length);
  std::__cxx11::string::append((char *)&local_2d0);
  cmsys::SystemTools::MakeDirectory(&local_2d0,(mode_t *)0x0);
  std::__cxx11::string::append((char *)&local_2d0);
  std::__cxx11::string::_M_append
            ((char *)&local_2d0,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p);
  bVar5 = cmsys::SystemTools::FileExists(&local_2d0,true);
  if (bVar5) {
LAB_003688b1:
    cmsys::SystemTools::RemoveFile(&local_2b0);
  }
  else {
    bVar5 = cmSystemTools::RenameFile(&local_2b0,&local_2d0);
    if (!bVar5) goto LAB_003688b1;
  }
  local_290 = (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               *)&this->ReplyFiles;
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            (local_290,__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
LAB_003688e9:
  local_230._0_8_ = _VTT;
  *(undefined8 *)(local_230 + (long)_VTT[-3]) = _vtable;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmFileAPI::WriteJsonFile(
  Json::Value const& value, std::string const& prefix,
  std::string (*computeSuffix)(std::string const&))
{
  std::string fileName;

  // Write the json file with a temporary name.
  std::string const& tmpFile = this->APIv1 + "/tmp.json";
  cmsys::ofstream ftmp(tmpFile.c_str());
  this->JsonWriter->write(value, &ftmp);
  ftmp << "\n";
  ftmp.close();
  if (!ftmp) {
    cmSystemTools::RemoveFile(tmpFile);
    return fileName;
  }

  // Compute the final name for the file.
  fileName = prefix + "-" + computeSuffix(tmpFile) + ".json";

  // Create the destination.
  std::string file = this->APIv1 + "/reply";
  cmSystemTools::MakeDirectory(file);
  file += "/";
  file += fileName;

  // If the final name already exists then assume it has proper content.
  // Otherwise, atomically place the reply file at its final name
  if (cmSystemTools::FileExists(file, true) ||
      !cmSystemTools::RenameFile(tmpFile, file)) {
    cmSystemTools::RemoveFile(tmpFile);
  }

  // Record this among files we have just written.
  this->ReplyFiles.insert(fileName);

  return fileName;
}